

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O3

void __thiscall Automaton::build(Automaton *this)

{
  ItemList *pIVar1;
  _List_node_base *p_Var2;
  State *pSVar3;
  _List_node_base *p_Var4;
  State *pSVar5;
  long in_FS_OFFSET;
  pair<std::_List_iterator<State>,_bool> pVar6;
  State local_80;
  Item local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.rule._M_node = (this->_M_grammar->goal)._M_node;
  local_30.dot._M_node = local_30.rule._M_node[1]._M_prev;
  local_80.kernel.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node._M_size = 0;
  pIVar1 = &local_80.closure;
  local_80.defaultReduce._M_node = (_List_node_base *)&this->_M_grammar->rules;
  local_80.closure.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node._M_size = 0;
  local_80.bundle.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<QString>,_std::_List_iterator<State>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>_>_>
        )(totally_ordered_wrapper<QMapData<std::map<std::_List_iterator<QString>,_std::_List_iterator<State>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>_>_*>
          )0x0;
  local_80.reads.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>_>
        )(totally_ordered_wrapper<QMapData<std::map<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>_*>
          )0x0;
  local_80.follows.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>_>
        )(totally_ordered_wrapper<QMapData<std::map<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>_*>
          )0x0;
  local_80.kernel.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_80;
  local_80.kernel.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&local_80;
  local_80.closure.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)pIVar1;
  local_80.closure.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)pIVar1;
  State::insert(&local_80,&local_30);
  pVar6 = internState(this,&local_80);
  (this->start)._M_node = (_List_node_base *)pVar6.first._M_node;
  closure(this,(_List_node_base *)pVar6.first._M_node);
  buildNullables(this);
  buildLookbackSets(this);
  buildReads(this);
  buildIncludesAndFollows(this);
  buildLookaheads(this);
  buildDefaultReduceActions(this);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_80.follows.d);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_80.reads.d);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<QString>,_std::_List_iterator<State>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_80.bundle.d);
  p_Var4 = local_80.closure.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while (pSVar5 = (State *)local_80.kernel.super__List_base<Item,_std::allocator<Item>_>._M_impl.
                           _M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)pIVar1) {
    p_Var2 = (((_List_base<Item,_std::allocator<Item>_> *)&p_Var4->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete(p_Var4,0x20);
    p_Var4 = p_Var2;
  }
  while (pSVar5 != &local_80) {
    pSVar3 = (State *)(pSVar5->kernel).super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node
                      .super__List_node_base._M_next;
    operator_delete(pSVar5,0x20);
    pSVar5 = pSVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Automaton::build ()
{
  Item item;
  item.rule = _M_grammar->goal;
  item.dot = _M_grammar->goal->rhs.begin ();

  State tmp (_M_grammar);
  tmp.insert (item);
  start = internState (tmp).first;

  closure (start);

  buildNullables ();
  buildLookbackSets ();
  buildReads ();
  buildIncludesAndFollows ();
  buildLookaheads ();
  buildDefaultReduceActions ();
}